

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.cpp
# Opt level: O2

void __thiscall VC1SequenceHeader::setFPS(VC1SequenceHeader *this,double value)

{
  int value_00;
  uint uVar1;
  long lVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  ostringstream ss;
  
  if (this->m_fpsFieldBitVal < 1) {
    return;
  }
  lVar2 = lround(value);
  uVar4 = (int)lVar2 * 1000;
  lVar2 = lround((double)(int)uVar4 / value);
  if (((((uVar4 == 24000) || (uVar4 == 25000)) || (uVar4 == 30000)) ||
      ((uVar4 == 60000 || (uVar4 == 50000)))) && (uVar1 = (uint)lVar2, (uVar1 & 0xfffffffe) == 1000)
     ) {
    this->time_base_den = uVar4;
    this->time_base_num = uVar1;
    if ((short)uVar4 == 24000) {
      value_00 = 1;
    }
    else {
      uVar4 = uVar4 & 0xffff;
      if (uVar4 == 25000) {
        value_00 = 2;
      }
      else if (uVar4 == 30000) {
        value_00 = 3;
      }
      else if (uVar4 == 50000) {
        value_00 = 4;
      }
      else {
        if (uVar4 != 60000) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          std::operator<<((ostream *)&ss,
                          "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
                         );
          puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar3 = 0x15f;
          *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
          if (local_1d0 == &local_1c0) {
            *(ulong *)(puVar3 + 6) = CONCAT71(uStack_1bf,local_1c0);
            *(undefined8 *)(puVar3 + 8) = uStack_1b8;
          }
          else {
            *(undefined1 **)(puVar3 + 2) = local_1d0;
            *(ulong *)(puVar3 + 6) = CONCAT71(uStack_1bf,local_1c0);
          }
          *(undefined8 *)(puVar3 + 4) = local_1c8;
          local_1c0 = 0;
          __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        value_00 = 5;
      }
    }
    VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal,8,value_00);
    VC1Unit::updateBits(&this->super_VC1Unit,this->m_fpsFieldBitVal + 8,4,(uVar1 != 1000) + 1);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,
                  "Can\'t overwrite stream fps. Non standard fps values not supported for VC-1 streams"
                 );
  puVar3 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar3 = 0x15f;
  *(undefined4 **)(puVar3 + 2) = puVar3 + 6;
  if (local_1b0 == &local_1a0) {
    *(ulong *)(puVar3 + 6) = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)(puVar3 + 8) = uStack_198;
  }
  else {
    *(undefined1 **)(puVar3 + 2) = local_1b0;
    *(ulong *)(puVar3 + 6) = CONCAT71(uStack_19f,local_1a0);
  }
  *(undefined8 *)(puVar3 + 4) = local_1a8;
  local_1a8 = 0;
  local_1a0 = 0;
  local_1b0 = &local_1a0;
  __cxa_throw(puVar3,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void VC1SequenceHeader::setFPS(const double value)
{
    // if (value < 25.0 && pulldown)
    //	value *= 1.25;

    if (m_fpsFieldBitVal > 0)
    {
        int nr;
        const int time_scale = lround(value) * 1000;
        const int num_units_in_tick = lround(time_scale / value);
        if ((time_scale == 24000 || time_scale == 25000 || time_scale == 30000 || time_scale == 50000 ||
             time_scale == 60000) &&
            (num_units_in_tick == 1000 || num_units_in_tick == 1001))
        {
            time_base_den = time_scale;
            time_base_num = num_units_in_tick;
        }
        else
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")

        switch (time_scale)
        {
        case 24000:
            nr = 1;
            break;
        case 25000:
            nr = 2;
            break;
        case 30000:
            nr = 3;
            break;
        case 50000:
            nr = 4;
            break;
        case 60000:
            nr = 5;
            break;
        default:
            THROW(ERR_VC1_ERR_FPS, "Can't overwrite stream fps. Non standard fps values not supported for VC-1 streams")
        }
        const int dr = (num_units_in_tick == 1000) ? 1 : 2;

        updateBits(m_fpsFieldBitVal, 8, nr);
        updateBits(m_fpsFieldBitVal + 8, 4, dr);
    }
}